

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined8 *puVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  size_t sVar12;
  undefined8 uVar13;
  Scene *pSVar14;
  Ref<embree::Geometry> *pRVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined8 uVar39;
  byte bVar40;
  int iVar41;
  int iVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined1 (*pauVar45) [16];
  ulong uVar47;
  long lVar48;
  undefined1 (*pauVar49) [16];
  ulong uVar50;
  ulong uVar51;
  size_t sVar52;
  size_t i;
  long lVar53;
  long lVar54;
  ulong uVar55;
  float fVar56;
  uint uVar57;
  float fVar58;
  float fVar67;
  float fVar70;
  vint4 bi;
  uint uVar68;
  uint uVar71;
  float fVar73;
  uint uVar74;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar69;
  float fVar72;
  float fVar75;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar76;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar77 [16];
  float fVar81;
  float fVar83;
  float fVar84;
  float fVar89;
  float fVar93;
  vint4 ai;
  uint uVar82;
  uint uVar90;
  uint uVar94;
  float fVar97;
  uint uVar98;
  undefined1 auVar85 [16];
  float fVar91;
  float fVar92;
  float fVar95;
  float fVar96;
  float fVar99;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar100;
  float fVar105;
  float fVar106;
  vint4 ai_1;
  undefined1 auVar101 [16];
  float fVar107;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar108;
  float fVar109;
  float fVar114;
  float fVar116;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar115;
  float fVar117;
  float fVar118;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar119;
  float fVar124;
  float fVar125;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar126;
  float fVar129;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  int iVar130;
  int iVar131;
  int iVar132;
  vint4 bi_1;
  int iVar133;
  int iVar134;
  int iVar135;
  int iVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10a8 [16];
  int local_1098;
  int iStack_1094;
  int iStack_1090;
  int iStack_108c;
  float local_1038 [4];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_fe8 [16];
  float local_fd8 [4];
  float local_fc8 [4];
  undefined1 local_fb8 [16];
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined1 local_f88 [16];
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  vbool<4> valid;
  ulong uVar46;
  
  pauVar49 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar10 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar11 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar50 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar51 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar42 = (tray->tnear).field_0.i[k];
  iVar130 = (tray->tfar).field_0.i[k];
  iVar131 = iVar130;
  iVar132 = iVar130;
  iVar133 = iVar130;
  iVar134 = iVar42;
  iVar135 = iVar42;
  iVar136 = iVar42;
  local_1098 = iVar42;
  iStack_1094 = iVar42;
  iStack_1090 = iVar42;
  iStack_108c = iVar42;
LAB_006e84f2:
  do {
    do {
      if (pauVar49 == (undefined1 (*) [16])&local_f78) {
        return;
      }
      pauVar45 = pauVar49 + -1;
      pauVar49 = pauVar49 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= *(float *)((long)*pauVar45 + 8) &&
             *(float *)((long)*pauVar45 + 8) != *(float *)(ray + k * 4 + 0x80));
    pauVar45 = (undefined1 (*) [16])&local_f78;
    sVar52 = *(size_t *)*pauVar49;
    while ((sVar52 & 8) == 0) {
      pfVar1 = (float *)(sVar52 + 0x20 + uVar47);
      fVar56 = (*pfVar1 - fVar6) * fVar9;
      fVar67 = (pfVar1[1] - fVar6) * fVar9;
      fVar70 = (pfVar1[2] - fVar6) * fVar9;
      fVar73 = (pfVar1[3] - fVar6) * fVar9;
      pfVar1 = (float *)(sVar52 + 0x20 + uVar50);
      fVar81 = (*pfVar1 - fVar7) * fVar10;
      fVar89 = (pfVar1[1] - fVar7) * fVar10;
      fVar93 = (pfVar1[2] - fVar7) * fVar10;
      fVar97 = (pfVar1[3] - fVar7) * fVar10;
      uVar82 = (uint)((int)fVar81 < (int)fVar56) * (int)fVar56 |
               (uint)((int)fVar81 >= (int)fVar56) * (int)fVar81;
      uVar90 = (uint)((int)fVar89 < (int)fVar67) * (int)fVar67 |
               (uint)((int)fVar89 >= (int)fVar67) * (int)fVar89;
      uVar94 = (uint)((int)fVar93 < (int)fVar70) * (int)fVar70 |
               (uint)((int)fVar93 >= (int)fVar70) * (int)fVar93;
      uVar98 = (uint)((int)fVar97 < (int)fVar73) * (int)fVar73 |
               (uint)((int)fVar97 >= (int)fVar73) * (int)fVar97;
      pfVar1 = (float *)(sVar52 + 0x20 + uVar51);
      fVar56 = (*pfVar1 - fVar8) * fVar11;
      fVar67 = (pfVar1[1] - fVar8) * fVar11;
      fVar70 = (pfVar1[2] - fVar8) * fVar11;
      fVar73 = (pfVar1[3] - fVar8) * fVar11;
      uVar57 = (uint)((int)fVar56 < iVar42) * iVar42 | (uint)((int)fVar56 >= iVar42) * (int)fVar56;
      uVar68 = (uint)((int)fVar67 < iVar134) * iVar134 |
               (uint)((int)fVar67 >= iVar134) * (int)fVar67;
      uVar71 = (uint)((int)fVar70 < iVar135) * iVar135 |
               (uint)((int)fVar70 >= iVar135) * (int)fVar70;
      uVar74 = (uint)((int)fVar73 < iVar136) * iVar136 |
               (uint)((int)fVar73 >= iVar136) * (int)fVar73;
      local_1038[0] =
           (float)(((int)uVar57 < (int)uVar82) * uVar82 | ((int)uVar57 >= (int)uVar82) * uVar57);
      local_1038[1] =
           (float)(((int)uVar68 < (int)uVar90) * uVar90 | ((int)uVar68 >= (int)uVar90) * uVar68);
      local_1038[2] =
           (float)(((int)uVar71 < (int)uVar94) * uVar94 | ((int)uVar71 >= (int)uVar94) * uVar71);
      local_1038[3] =
           (float)(((int)uVar74 < (int)uVar98) * uVar98 | ((int)uVar74 >= (int)uVar98) * uVar74);
      pfVar1 = (float *)(sVar52 + 0x20 + (uVar47 ^ 0x10));
      fVar56 = (*pfVar1 - fVar6) * fVar9;
      fVar67 = (pfVar1[1] - fVar6) * fVar9;
      fVar70 = (pfVar1[2] - fVar6) * fVar9;
      fVar73 = (pfVar1[3] - fVar6) * fVar9;
      pfVar1 = (float *)(sVar52 + 0x20 + (uVar50 ^ 0x10));
      fVar81 = (*pfVar1 - fVar7) * fVar10;
      fVar89 = (pfVar1[1] - fVar7) * fVar10;
      fVar93 = (pfVar1[2] - fVar7) * fVar10;
      fVar97 = (pfVar1[3] - fVar7) * fVar10;
      uVar82 = (uint)((int)fVar56 < (int)fVar81) * (int)fVar56 |
               (uint)((int)fVar56 >= (int)fVar81) * (int)fVar81;
      uVar90 = (uint)((int)fVar67 < (int)fVar89) * (int)fVar67 |
               (uint)((int)fVar67 >= (int)fVar89) * (int)fVar89;
      uVar94 = (uint)((int)fVar70 < (int)fVar93) * (int)fVar70 |
               (uint)((int)fVar70 >= (int)fVar93) * (int)fVar93;
      uVar98 = (uint)((int)fVar73 < (int)fVar97) * (int)fVar73 |
               (uint)((int)fVar73 >= (int)fVar97) * (int)fVar97;
      pfVar1 = (float *)(sVar52 + 0x20 + (uVar51 ^ 0x10));
      fVar56 = (*pfVar1 - fVar8) * fVar11;
      fVar67 = (pfVar1[1] - fVar8) * fVar11;
      fVar70 = (pfVar1[2] - fVar8) * fVar11;
      fVar73 = (pfVar1[3] - fVar8) * fVar11;
      uVar57 = (uint)(iVar130 < (int)fVar56) * iVar130 |
               (uint)(iVar130 >= (int)fVar56) * (int)fVar56;
      uVar68 = (uint)(iVar131 < (int)fVar67) * iVar131 |
               (uint)(iVar131 >= (int)fVar67) * (int)fVar67;
      uVar71 = (uint)(iVar132 < (int)fVar70) * iVar132 |
               (uint)(iVar132 >= (int)fVar70) * (int)fVar70;
      uVar74 = (uint)(iVar133 < (int)fVar73) * iVar133 |
               (uint)(iVar133 >= (int)fVar73) * (int)fVar73;
      auVar85._0_4_ =
           -(uint)((int)(((int)uVar82 < (int)uVar57) * uVar82 |
                        ((int)uVar82 >= (int)uVar57) * uVar57) < (int)local_1038[0]);
      auVar85._4_4_ =
           -(uint)((int)(((int)uVar90 < (int)uVar68) * uVar90 |
                        ((int)uVar90 >= (int)uVar68) * uVar68) < (int)local_1038[1]);
      auVar85._8_4_ =
           -(uint)((int)(((int)uVar94 < (int)uVar71) * uVar94 |
                        ((int)uVar94 >= (int)uVar71) * uVar71) < (int)local_1038[2]);
      auVar85._12_4_ =
           -(uint)((int)(((int)uVar98 < (int)uVar74) * uVar98 |
                        ((int)uVar98 >= (int)uVar74) * uVar74) < (int)local_1038[3]);
      iVar41 = movmskps((int)pauVar45,auVar85);
      if (iVar41 == 0xf) goto LAB_006e84f2;
      bVar40 = (byte)iVar41 ^ 0xf;
      uVar55 = sVar52 & 0xfffffffffffffff0;
      lVar53 = 0;
      if (bVar40 != 0) {
        for (; (bVar40 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
        }
      }
      sVar52 = *(size_t *)(uVar55 + lVar53 * 8);
      uVar57 = bVar40 - 1 & (uint)bVar40;
      pauVar45 = pauVar49;
      if (uVar57 != 0) {
        fVar56 = local_1038[lVar53];
        lVar53 = 0;
        if (uVar57 != 0) {
          for (; (uVar57 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
          }
        }
        sVar12 = *(size_t *)(uVar55 + lVar53 * 8);
        fVar67 = local_1038[lVar53];
        uVar57 = uVar57 - 1 & uVar57;
        if (uVar57 == 0) {
          pauVar45 = pauVar49 + 1;
          if ((uint)fVar56 < (uint)fVar67) {
            *(size_t *)*pauVar49 = sVar12;
            *(float *)((long)*pauVar49 + 8) = fVar67;
            pauVar49 = pauVar45;
          }
          else {
            *(size_t *)*pauVar49 = sVar52;
            *(float *)((long)*pauVar49 + 8) = fVar56;
            pauVar49 = pauVar45;
            sVar52 = sVar12;
          }
        }
        else {
          auVar101._8_4_ = fVar56;
          auVar101._0_8_ = sVar52;
          auVar101._12_4_ = 0;
          auVar111._8_4_ = fVar67;
          auVar111._0_8_ = sVar12;
          auVar111._12_4_ = 0;
          lVar53 = 0;
          if (uVar57 != 0) {
            for (; (uVar57 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
            }
          }
          uVar13 = *(undefined8 *)(uVar55 + lVar53 * 8);
          fVar70 = local_1038[lVar53];
          auVar128._8_4_ = fVar70;
          auVar128._0_8_ = uVar13;
          auVar128._12_4_ = 0;
          auVar122._8_4_ = -(uint)((int)fVar56 < (int)fVar67);
          uVar57 = uVar57 - 1 & uVar57;
          if (uVar57 == 0) {
            auVar122._4_4_ = auVar122._8_4_;
            auVar122._0_4_ = auVar122._8_4_;
            auVar122._12_4_ = auVar122._8_4_;
            auVar120._8_4_ = fVar67;
            auVar120._0_8_ = sVar12;
            auVar120._12_4_ = 0;
            auVar121 = blendvps(auVar120,auVar101,auVar122);
            auVar85 = blendvps(auVar101,auVar111,auVar122);
            auVar59._8_4_ = -(uint)(auVar121._8_4_ < (int)fVar70);
            auVar59._4_4_ = auVar59._8_4_;
            auVar59._0_4_ = auVar59._8_4_;
            auVar59._12_4_ = auVar59._8_4_;
            auVar110._8_4_ = fVar70;
            auVar110._0_8_ = uVar13;
            auVar110._12_4_ = 0;
            auVar111 = blendvps(auVar110,auVar121,auVar59);
            auVar122 = blendvps(auVar121,auVar128,auVar59);
            auVar60._8_4_ = -(uint)(auVar85._8_4_ < auVar122._8_4_);
            auVar60._4_4_ = auVar60._8_4_;
            auVar60._0_4_ = auVar60._8_4_;
            auVar60._12_4_ = auVar60._8_4_;
            auVar101 = blendvps(auVar122,auVar85,auVar60);
            auVar85 = blendvps(auVar85,auVar122,auVar60);
            *pauVar49 = auVar85;
            pauVar49[1] = auVar101;
            sVar52 = auVar111._0_8_;
            pauVar45 = pauVar49 + 2;
            pauVar49 = pauVar45;
          }
          else {
            lVar53 = 0;
            if (uVar57 != 0) {
              for (; (uVar57 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
              }
            }
            auVar121._4_4_ = auVar122._8_4_;
            auVar121._0_4_ = auVar122._8_4_;
            auVar121._8_4_ = auVar122._8_4_;
            auVar121._12_4_ = auVar122._8_4_;
            auVar122 = blendvps(auVar111,auVar101,auVar121);
            auVar85 = blendvps(auVar101,auVar111,auVar121);
            auVar127._8_4_ = local_1038[lVar53];
            auVar127._0_8_ = *(undefined8 *)(uVar55 + lVar53 * 8);
            auVar127._12_4_ = 0;
            auVar61._8_4_ = -(uint)((int)fVar70 < (int)local_1038[lVar53]);
            auVar61._4_4_ = auVar61._8_4_;
            auVar61._0_4_ = auVar61._8_4_;
            auVar61._12_4_ = auVar61._8_4_;
            auVar111 = blendvps(auVar127,auVar128,auVar61);
            auVar101 = blendvps(auVar128,auVar127,auVar61);
            auVar62._8_4_ = -(uint)(auVar85._8_4_ < auVar101._8_4_);
            auVar62._4_4_ = auVar62._8_4_;
            auVar62._0_4_ = auVar62._8_4_;
            auVar62._12_4_ = auVar62._8_4_;
            auVar128 = blendvps(auVar101,auVar85,auVar62);
            auVar85 = blendvps(auVar85,auVar101,auVar62);
            auVar63._8_4_ = -(uint)(auVar122._8_4_ < auVar111._8_4_);
            auVar63._4_4_ = auVar63._8_4_;
            auVar63._0_4_ = auVar63._8_4_;
            auVar63._12_4_ = auVar63._8_4_;
            auVar101 = blendvps(auVar111,auVar122,auVar63);
            auVar122 = blendvps(auVar122,auVar111,auVar63);
            auVar64._8_4_ = -(uint)(auVar122._8_4_ < auVar128._8_4_);
            auVar64._4_4_ = auVar64._8_4_;
            auVar64._0_4_ = auVar64._8_4_;
            auVar64._12_4_ = auVar64._8_4_;
            auVar111 = blendvps(auVar128,auVar122,auVar64);
            auVar122 = blendvps(auVar122,auVar128,auVar64);
            *pauVar49 = auVar85;
            pauVar49[1] = auVar122;
            pauVar49[2] = auVar111;
            sVar52 = auVar101._0_8_;
            pauVar45 = pauVar49 + 3;
            pauVar49 = pauVar45;
          }
        }
      }
    }
    uVar55 = sVar52 & 0xfffffffffffffff0;
    for (lVar53 = 0; lVar53 != (ulong)((uint)sVar52 & 0xf) - 8; lVar53 = lVar53 + 1) {
      lVar48 = lVar53 * 0xb0;
      pfVar1 = (float *)(uVar55 + 0x80 + lVar48);
      fVar89 = *pfVar1;
      fVar93 = pfVar1[1];
      fVar97 = pfVar1[2];
      fVar20 = pfVar1[3];
      pfVar1 = (float *)(uVar55 + 0x40 + lVar48);
      fVar21 = *pfVar1;
      fVar22 = pfVar1[1];
      fVar23 = pfVar1[2];
      fVar24 = pfVar1[3];
      pfVar1 = (float *)(uVar55 + 0x70 + lVar48);
      fVar25 = *pfVar1;
      fVar26 = pfVar1[1];
      fVar27 = pfVar1[2];
      fVar28 = pfVar1[3];
      pfVar1 = (float *)(uVar55 + 0x50 + lVar48);
      fVar29 = *pfVar1;
      fVar30 = pfVar1[1];
      fVar31 = pfVar1[2];
      fVar32 = pfVar1[3];
      fVar100 = fVar25 * fVar29 - fVar89 * fVar21;
      fVar105 = fVar26 * fVar30 - fVar93 * fVar22;
      fVar106 = fVar27 * fVar31 - fVar97 * fVar23;
      fVar107 = fVar28 * fVar32 - fVar20 * fVar24;
      pfVar2 = (float *)(uVar55 + 0x60 + lVar48);
      fVar33 = pfVar2[2];
      fVar34 = pfVar2[3];
      pfVar1 = (float *)(uVar55 + lVar48);
      puVar3 = (undefined8 *)(uVar55 + 0x10 + lVar48);
      uVar13 = *puVar3;
      uVar39 = puVar3[1];
      pfVar4 = (float *)(uVar55 + 0x20 + lVar48);
      pfVar5 = (float *)(uVar55 + 0x30 + lVar48);
      fVar35 = *pfVar5;
      fVar36 = pfVar5[1];
      fVar37 = pfVar5[2];
      fVar38 = pfVar5[3];
      fVar137 = fVar89 * fVar35 - fVar29 * *pfVar2;
      fVar138 = fVar93 * fVar36 - fVar30 * pfVar2[1];
      fVar139 = fVar97 * fVar37 - fVar31 * fVar33;
      fVar140 = fVar20 * fVar38 - fVar32 * fVar34;
      fVar56 = *(float *)(ray + k * 4);
      fVar67 = *(float *)(ray + k * 4 + 0x20);
      fVar70 = *(float *)(ray + k * 4 + 0x40);
      fVar83 = *pfVar1 - fVar56;
      fVar91 = pfVar1[1] - fVar56;
      fVar95 = pfVar1[2] - fVar56;
      fVar56 = pfVar1[3] - fVar56;
      fVar108 = *pfVar4 - fVar67;
      fVar114 = pfVar4[1] - fVar67;
      fVar116 = pfVar4[2] - fVar67;
      fVar67 = pfVar4[3] - fVar67;
      fVar73 = *(float *)(ray + k * 4 + 0x60);
      fVar58 = fVar70 * fVar108 - fVar83 * fVar73;
      fVar69 = fVar70 * fVar114 - fVar91 * fVar73;
      fVar72 = fVar70 * fVar116 - fVar95 * fVar73;
      fVar75 = fVar70 * fVar67 - fVar56 * fVar73;
      fVar126 = (float)*(undefined8 *)pfVar2;
      fVar129 = (float)((ulong)*(undefined8 *)pfVar2 >> 0x20);
      fVar76 = fVar21 * fVar126 - fVar25 * fVar35;
      fVar78 = fVar22 * fVar129 - fVar26 * fVar36;
      fVar79 = fVar23 * fVar33 - fVar27 * fVar37;
      fVar80 = fVar24 * fVar34 - fVar28 * fVar38;
      fVar81 = *(float *)(ray + k * 4 + 0x10);
      local_10e8 = (float)uVar13;
      fStack_10e4 = (float)((ulong)uVar13 >> 0x20);
      fStack_10e0 = (float)uVar39;
      fStack_10dc = (float)((ulong)uVar39 >> 0x20);
      local_10e8 = local_10e8 - fVar81;
      fStack_10e4 = fStack_10e4 - fVar81;
      fStack_10e0 = fStack_10e0 - fVar81;
      fStack_10dc = fStack_10dc - fVar81;
      fVar81 = *(float *)(ray + k * 4 + 0x50);
      fVar109 = fVar73 * local_10e8 - fVar81 * fVar108;
      fVar115 = fVar73 * fStack_10e4 - fVar81 * fVar114;
      fVar117 = fVar73 * fStack_10e0 - fVar81 * fVar116;
      fVar118 = fVar73 * fStack_10dc - fVar81 * fVar67;
      fVar84 = fVar81 * fVar83 - fVar70 * local_10e8;
      fVar92 = fVar81 * fVar91 - fVar70 * fStack_10e4;
      fVar96 = fVar81 * fVar95 - fVar70 * fStack_10e0;
      fVar99 = fVar81 * fVar56 - fVar70 * fStack_10dc;
      fVar119 = fVar73 * fVar76 + fVar137 * fVar81 + fVar100 * fVar70;
      fVar124 = fVar73 * fVar78 + fVar138 * fVar81 + fVar105 * fVar70;
      fVar125 = fVar73 * fVar79 + fVar139 * fVar81 + fVar106 * fVar70;
      fVar81 = fVar73 * fVar80 + fVar140 * fVar81 + fVar107 * fVar70;
      uVar68 = (uint)fVar119 & 0x80000000;
      uVar71 = (uint)fVar124 & 0x80000000;
      uVar74 = (uint)fVar125 & 0x80000000;
      uVar82 = (uint)fVar81 & 0x80000000;
      local_1038[0] =
           (float)((uint)(fVar126 * fVar109 + fVar25 * fVar58 + fVar89 * fVar84) ^ uVar68);
      local_1038[1] =
           (float)((uint)(fVar129 * fVar115 + fVar26 * fVar69 + fVar93 * fVar92) ^ uVar71);
      local_1038[2] = (float)((uint)(fVar33 * fVar117 + fVar27 * fVar72 + fVar97 * fVar96) ^ uVar74)
      ;
      local_1038[3] = (float)((uint)(fVar34 * fVar118 + fVar28 * fVar75 + fVar20 * fVar99) ^ uVar82)
      ;
      local_1028._0_4_ =
           (float)((uint)(fVar109 * fVar35 + fVar58 * fVar21 + fVar84 * fVar29) ^ uVar68);
      local_1028._4_4_ =
           (float)((uint)(fVar115 * fVar36 + fVar69 * fVar22 + fVar92 * fVar30) ^ uVar71);
      local_1028._8_4_ =
           (float)((uint)(fVar117 * fVar37 + fVar72 * fVar23 + fVar96 * fVar31) ^ uVar74);
      local_1028._12_4_ =
           (float)((uint)(fVar118 * fVar38 + fVar75 * fVar24 + fVar99 * fVar32) ^ uVar82);
      fVar70 = ABS(fVar119);
      fVar73 = ABS(fVar124);
      local_1008._0_8_ = CONCAT44(fVar124,fVar119) & 0x7fffffff7fffffff;
      local_1008._8_4_ = ABS(fVar125);
      local_1008._12_4_ = ABS(fVar81);
      bVar18 = local_1038[0] + local_1028._0_4_ <= fVar70 &&
               ((0.0 <= local_1028._0_4_ && 0.0 <= local_1038[0]) && fVar119 != 0.0);
      auVar123._0_4_ = -(uint)bVar18;
      bVar19 = local_1038[1] + local_1028._4_4_ <= fVar73 &&
               ((0.0 <= local_1028._4_4_ && 0.0 <= local_1038[1]) && fVar124 != 0.0);
      auVar123._4_4_ = -(uint)bVar19;
      bVar17 = local_1038[2] + local_1028._8_4_ <= local_1008._8_4_ &&
               ((0.0 <= local_1028._8_4_ && 0.0 <= local_1038[2]) && fVar125 != 0.0);
      auVar123._8_4_ = -(uint)bVar17;
      bVar16 = local_1038[3] + local_1028._12_4_ <= local_1008._12_4_ &&
               ((0.0 <= local_1028._12_4_ && 0.0 <= local_1038[3]) && fVar81 != 0.0);
      auVar123._12_4_ = -(uint)bVar16;
      uVar57 = movmskps((int)pauVar45,auVar123);
      pauVar45 = (undefined1 (*) [16])(ulong)uVar57;
      if (uVar57 != 0) {
        local_1018._0_4_ =
             (float)(uVar68 ^ (uint)(fVar83 * fVar100 + local_10e8 * fVar137 + fVar108 * fVar76));
        local_1018._4_4_ =
             (float)(uVar71 ^ (uint)(fVar91 * fVar105 + fStack_10e4 * fVar138 + fVar114 * fVar78));
        local_1018._8_4_ =
             (float)(uVar74 ^ (uint)(fVar95 * fVar106 + fStack_10e0 * fVar139 + fVar116 * fVar79));
        local_1018._12_4_ =
             (float)(uVar82 ^ (uint)(fVar56 * fVar107 + fStack_10dc * fVar140 + fVar67 * fVar80));
        fVar56 = *(float *)(ray + k * 4 + 0x30);
        fVar67 = *(float *)(ray + k * 4 + 0x80);
        local_10a8._0_4_ =
             -(uint)((local_1018._0_4_ <= fVar67 * fVar70 && fVar56 * fVar70 < local_1018._0_4_) &&
                    bVar18);
        local_10a8._4_4_ =
             -(uint)((local_1018._4_4_ <= fVar67 * fVar73 && fVar56 * fVar73 < local_1018._4_4_) &&
                    bVar19);
        local_10a8._8_4_ =
             -(uint)((local_1018._8_4_ <= fVar67 * local_1008._8_4_ &&
                     fVar56 * local_1008._8_4_ < local_1018._8_4_) && bVar17);
        local_10a8._12_4_ =
             -(uint)((local_1018._12_4_ <= fVar67 * local_1008._12_4_ &&
                     fVar56 * local_1008._12_4_ < local_1018._12_4_) && bVar16);
        uVar57 = movmskps(uVar57,local_10a8);
        pauVar45 = (undefined1 (*) [16])(ulong)uVar57;
        if (uVar57 != 0) {
          local_fe8 = local_10a8;
          local_fa8 = CONCAT44(fVar105,fVar100);
          uStack_fa0 = CONCAT44(fVar107,fVar106);
          local_f98 = CONCAT44(fVar138,fVar137);
          uStack_f90 = CONCAT44(fVar140,fVar139);
          local_f88._4_4_ = fVar78;
          local_f88._0_4_ = fVar76;
          local_f88._8_4_ = fVar79;
          local_f88._12_4_ = fVar80;
          pSVar14 = context->scene;
          auVar85 = rcpps(local_f88,local_1008);
          fVar56 = auVar85._0_4_;
          fVar67 = auVar85._4_4_;
          fVar81 = auVar85._8_4_;
          fVar89 = auVar85._12_4_;
          fVar56 = (1.0 - fVar70 * fVar56) * fVar56 + fVar56;
          fVar67 = (1.0 - fVar73 * fVar67) * fVar67 + fVar67;
          fVar81 = (1.0 - local_1008._8_4_ * fVar81) * fVar81 + fVar81;
          fVar89 = (1.0 - local_1008._12_4_ * fVar89) * fVar89 + fVar89;
          auVar77._0_4_ = local_1018._0_4_ * fVar56;
          auVar77._4_4_ = local_1018._4_4_ * fVar67;
          auVar77._8_4_ = local_1018._8_4_ * fVar81;
          auVar77._12_4_ = local_1018._12_4_ * fVar89;
          local_fb8 = auVar77;
          local_fd8[0] = local_1038[0] * fVar56;
          local_fd8[1] = local_1038[1] * fVar67;
          local_fd8[2] = local_1038[2] * fVar81;
          local_fd8[3] = local_1038[3] * fVar89;
          local_fc8[0] = fVar56 * local_1028._0_4_;
          local_fc8[1] = fVar67 * local_1028._4_4_;
          local_fc8[2] = fVar81 * local_1028._8_4_;
          local_fc8[3] = fVar89 * local_1028._12_4_;
          auVar101 = blendvps(_DAT_01f45a30,auVar77,local_10a8);
          auVar112._4_4_ = auVar101._0_4_;
          auVar112._0_4_ = auVar101._4_4_;
          auVar112._8_4_ = auVar101._12_4_;
          auVar112._12_4_ = auVar101._8_4_;
          auVar85 = minps(auVar112,auVar101);
          auVar86._0_8_ = auVar85._8_8_;
          auVar86._8_4_ = auVar85._0_4_;
          auVar86._12_4_ = auVar85._4_4_;
          auVar85 = minps(auVar86,auVar85);
          uVar57 = -(uint)(auVar85._0_4_ == auVar101._0_4_);
          uVar68 = -(uint)(auVar85._4_4_ == auVar101._4_4_);
          uVar71 = -(uint)(auVar85._8_4_ == auVar101._8_4_);
          uVar74 = -(uint)(auVar85._12_4_ == auVar101._12_4_);
          auVar104._4_4_ = uVar68;
          auVar104._0_4_ = uVar57;
          auVar102._0_4_ = uVar57 & local_10a8._0_4_;
          auVar102._4_4_ = uVar68 & local_10a8._4_4_;
          auVar102._8_4_ = uVar71 & local_10a8._8_4_;
          auVar102._12_4_ = uVar74 & local_10a8._12_4_;
          iVar42 = movmskps((int)pSVar14,auVar102);
          auVar103._8_4_ = 0xffffffff;
          auVar103._0_8_ = 0xffffffffffffffff;
          auVar103._12_4_ = 0xffffffff;
          if (iVar42 != 0) {
            auVar104._8_4_ = uVar71;
            auVar104._12_4_ = uVar74;
            auVar103 = auVar104;
          }
          auVar65._0_4_ = local_10a8._0_4_ & auVar103._0_4_;
          auVar65._4_4_ = local_10a8._4_4_ & auVar103._4_4_;
          auVar65._8_4_ = local_10a8._8_4_ & auVar103._8_4_;
          auVar65._12_4_ = local_10a8._12_4_ & auVar103._12_4_;
          uVar43 = movmskps(iVar42,auVar65);
          uVar46 = CONCAT44((int)((ulong)pSVar14 >> 0x20),uVar43);
          lVar54 = 0;
          if (uVar46 != 0) {
            for (; (uVar46 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
            }
          }
          pRVar15 = (pSVar14->geometries).items;
          uVar57 = *(uint *)(ray + k * 4 + 0x90);
          while (uVar68 = *(uint *)(lVar48 + uVar55 + 0x90 + lVar54 * 4),
                ((pRVar15[uVar68].ptr)->mask & uVar57) == 0) {
            *(undefined4 *)(local_10a8 + lVar54 * 4) = 0;
            uVar43 = (undefined4)((ulong)lVar54 >> 0x20);
            iVar42 = movmskps((int)lVar54,local_10a8);
            pauVar45 = (undefined1 (*) [16])CONCAT44(uVar43,iVar42);
            if (iVar42 == 0) goto LAB_006e89d6;
            auVar101 = blendvps(_DAT_01f45a30,auVar77,local_10a8);
            auVar113._4_4_ = auVar101._0_4_;
            auVar113._0_4_ = auVar101._4_4_;
            auVar113._8_4_ = auVar101._12_4_;
            auVar113._12_4_ = auVar101._8_4_;
            auVar85 = minps(auVar113,auVar101);
            auVar87._0_8_ = auVar85._8_8_;
            auVar87._8_4_ = auVar85._0_4_;
            auVar87._12_4_ = auVar85._4_4_;
            auVar85 = minps(auVar87,auVar85);
            auVar88._0_8_ =
                 CONCAT44(-(uint)(auVar85._4_4_ == auVar101._4_4_) & local_10a8._4_4_,
                          -(uint)(auVar85._0_4_ == auVar101._0_4_) & local_10a8._0_4_);
            auVar88._8_4_ = -(uint)(auVar85._8_4_ == auVar101._8_4_) & local_10a8._8_4_;
            auVar88._12_4_ = -(uint)(auVar85._12_4_ == auVar101._12_4_) & local_10a8._12_4_;
            iVar42 = movmskps(iVar42,auVar88);
            auVar66 = local_10a8;
            if (iVar42 != 0) {
              auVar66._8_4_ = auVar88._8_4_;
              auVar66._0_8_ = auVar88._0_8_;
              auVar66._12_4_ = auVar88._12_4_;
            }
            uVar44 = movmskps(iVar42,auVar66);
            uVar46 = CONCAT44(uVar43,uVar44);
            lVar54 = 0;
            if (uVar46 != 0) {
              for (; (uVar46 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
              }
            }
          }
          fVar56 = local_fd8[lVar54];
          fVar67 = local_fc8[lVar54];
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_fb8 + lVar54 * 4);
          *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)&local_fa8 + lVar54 * 4);
          *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)&local_f98 + lVar54 * 4);
          *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_f88 + lVar54 * 4);
          *(float *)(ray + k * 4 + 0xf0) = fVar56;
          *(float *)(ray + k * 4 + 0x100) = fVar67;
          *(undefined4 *)(ray + k * 4 + 0x110) =
               *(undefined4 *)(lVar48 + uVar55 + 0xa0 + lVar54 * 4);
          *(uint *)(ray + k * 4 + 0x120) = uVar68;
          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
          uVar57 = context->user->instPrimID[0];
          pauVar45 = (undefined1 (*) [16])(ulong)uVar57;
          *(uint *)(ray + k * 4 + 0x140) = uVar57;
        }
      }
LAB_006e89d6:
      iVar42 = local_1098;
      iVar134 = iStack_1094;
      iVar135 = iStack_1090;
      iVar136 = iStack_108c;
    }
    iVar130 = *(int *)(ray + k * 4 + 0x80);
    iVar131 = iVar130;
    iVar132 = iVar130;
    iVar133 = iVar130;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }